

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linearize.c
# Opt level: O2

void dmrC_kill_unreachable_bbs(dmr_C *C,entrypoint *ep)

{
  basic_block *bb;
  unsigned_long generation;
  undefined1 local_48 [8];
  ptr_list_iter bbiter__;
  
  generation = C->L->bb_generation + 1;
  C->L->bb_generation = generation;
  mark_bb_reachable(ep->entry->bb,generation);
  ptrlist_forward_iterator((ptr_list_iter *)local_48,(ptr_list *)ep->bbs);
  while( true ) {
    bb = (basic_block *)ptrlist_iter_next((ptr_list_iter *)local_48);
    if (bb == (basic_block *)0x0) break;
    if (bb->generation != generation) {
      dmrC_kill_bb(C,bb);
      bb->ep = (entrypoint *)0x0;
      ptrlist_iter_remove((ptr_list_iter *)local_48);
    }
  }
  ptrlist_pack((ptr_list **)&ep->bbs);
  return;
}

Assistant:

void dmrC_kill_unreachable_bbs(struct dmr_C *C, struct entrypoint *ep)
{
	struct basic_block *bb;
	unsigned long generation = ++C->L->bb_generation;

	mark_bb_reachable(ep->entry->bb, generation);
	FOR_EACH_PTR(ep->bbs, bb) {
		if (bb->generation == generation)
			continue;
		/* Mark it as being dead */
		dmrC_kill_bb(C, bb);
		bb->ep = NULL;
		DELETE_CURRENT_PTR(bb);
	} END_FOR_EACH_PTR(bb);
	ptrlist_pack((struct ptr_list **) &ep->bbs);
}